

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1556.c
# Opt level: O2

size_t header(void *ptr,size_t size,size_t nmemb,void *stream)

{
  ulong uVar1;
  
  uVar1 = size * nmemb;
  if (*stream <= uVar1 && uVar1 - *stream != 0) {
    *(ulong *)stream = uVar1;
  }
  return uVar1;
}

Assistant:

static size_t header(void *ptr, size_t size, size_t nmemb, void *stream)
{
  size_t headersize = size * nmemb;
  struct headerinfo *info = (struct headerinfo *)stream;
  (void)ptr;

  if(headersize > info->largest)
    /* remember the longest header */
    info->largest = headersize;

  return nmemb * size;
}